

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argv.hpp
# Opt level: O2

char * optflag(char ***argv,char *flagname,bool *flag)

{
  char cVar1;
  uint __line;
  int iVar2;
  char *pcVar3;
  char **ppcVar4;
  char *__s2;
  char *__s2_00;
  char temp_c_f [4];
  char temp_c_fno [8];
  
  ppcVar4 = *argv;
  pcVar3 = *ppcVar4;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "*argv != nullptr";
    __line = 0x62;
LAB_001a5e28:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/cpp/argv.hpp"
                  ,__line,"char *optflag(char **&, const char *, bool *)");
  }
  if (*flagname == '-') {
    cVar1 = flagname[1];
    if (cVar1 == 'f') {
      __s2 = "-fno-";
      __s2_00 = "-f";
    }
    else {
      if (cVar1 == '\0') {
        pcVar3 = "flagname[1] != 0";
        __line = 0x6d;
        goto LAB_001a5e28;
      }
      __s2_00 = temp_c_f;
      temp_c_f[2] = '\0';
      __s2 = temp_c_fno;
      builtin_strncpy(temp_c_fno + 2,"no-",4);
      temp_c_f[1] = cVar1;
      temp_c_f[0] = '-';
      temp_c_fno[1] = cVar1;
      temp_c_fno[0] = '-';
    }
    flagname = flagname + 2;
  }
  else {
    __s2 = "-fno-";
    __s2_00 = "-f";
  }
  if ((flag != (bool *)0x0) && (iVar2 = strncmp(pcVar3,__s2,5), iVar2 == 0)) {
    *ppcVar4 = pcVar3 + 5;
    pcVar3 = optget(argv,(char *)0x0,flagname,0);
    if (pcVar3 != (char *)0x0) {
      *flag = false;
      return pcVar3;
    }
    **argv = **argv + -5;
    ppcVar4 = *argv;
    pcVar3 = *ppcVar4;
  }
  iVar2 = strncmp(pcVar3,__s2_00,2);
  if (iVar2 == 0) {
    *ppcVar4 = pcVar3 + 2;
    pcVar3 = optget(argv,(char *)0x0,flagname,0);
    if (pcVar3 != (char *)0x0) {
      if (flag == (bool *)0x0) {
        return pcVar3;
      }
      *flag = true;
      return pcVar3;
    }
    **argv = **argv + -2;
  }
  return (char *)0x0;
}

Assistant:

inline char* optflag(char**& argv, const char* flagname, bool* flag)
{
    assert(*argv != nullptr);

    char temp_c_f[4], temp_c_fno[8];
    const char* c_f   = "-f";
    const char* c_fno = "-fno-";

    // in case one wants to use e.g. -m instead of -f
    if(flagname[0] == '-')
    {
        if(flagname[1] != 'f')
        {
            assert(flagname[1] != 0);

            strcpy(temp_c_f, c_f);
            strcpy(temp_c_fno, c_fno);
            temp_c_f[1] = flagname[1];
            temp_c_fno[1] = flagname[1];

            c_f = temp_c_f;
            c_fno = temp_c_fno;
        }

        flagname += 2;
    }

    if(flag && !strncmp(*argv, c_fno, 5))
    {
        *argv += 5;
        if(char* val = optget(argv, nullptr, flagname, 0))
        {
            *flag = false;
            return val;
        }
        else
        {
            *argv -= 5;
        }
    }

    if(!strncmp(*argv, c_f, 2))
    {
        *argv += 2;
        if(char* val = optget(argv, nullptr, flagname, 0))
        {
            if(flag) *flag = true;
            return val;
        }
        else
        {
            *argv -= 2;
        }
    }

    return nullptr;
}